

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O2

fid __thiscall ezexample::hash(ezexample *this,char c,string *fstr)

{
  vw *pvVar1;
  vw *pvVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  substring sVar5;
  substring sVar6;
  allocator local_59;
  char *local_58;
  long local_50;
  char *local_38;
  long local_30;
  
  this->str[0] = c;
  pvVar1 = this->vw_ref;
  std::__cxx11::string::string((string *)&local_38,(string *)fstr);
  pvVar2 = this->vw_ref;
  std::__cxx11::string::string((string *)&local_58,this->str,&local_59);
  sVar5.end = local_58 + local_50;
  sVar5.begin = local_58;
  uVar3 = (*pvVar2->p->hasher)(sVar5,(ulong)pvVar2->hash_seed);
  sVar6.end = local_38 + local_30;
  sVar6.begin = local_38;
  uVar4 = (*pvVar1->p->hasher)(sVar6,uVar3);
  uVar3 = pvVar1->parse_mask;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return (uint)uVar4 & (uint)uVar3;
}

Assistant:

inline fid hash(char c, std::string fstr)
  {
    str[0] = c;
    return VW::hash_feature(*vw_ref, fstr, VW::hash_space(*vw_ref, str));
  }